

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MDLImporter::GenerateOutputMeshes_3DGS_MDL7
          (MDLImporter *this,IntGroupData_MDL7 *groupData,IntSplitGroupData_MDL7 *splitGroupData)

{
  pointer *ppuVar1;
  size_t __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **ppvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  pointer pIVar4;
  pointer paVar5;
  iterator __position;
  IntBone_MDL7 *pIVar6;
  vector<aiMesh*,std::allocator<aiMesh*>> *this_00;
  iterator __position_00;
  pointer pvVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  aiVector3D **ppaVar23;
  pointer pvVar24;
  uint uVar25;
  aiMesh *paVar26;
  ulong *puVar27;
  aiFace *paVar28;
  aiVector3D *paVar29;
  uint *puVar30;
  long lVar31;
  Logger *this_01;
  aiBone **ppaVar32;
  aiBone *paVar33;
  aiVertexWeight *__s;
  pointer ppaVar34;
  aiFace *paVar35;
  pointer ppaVar36;
  ulong uVar37;
  uint uVar38;
  const_iterator k;
  ulong uVar39;
  pointer pvVar40;
  ulong uVar41;
  int iVar42;
  aiMesh *pcMesh;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  aaiVWeightList;
  aiMesh *local_498;
  aiVector3D **local_490;
  ulong local_488;
  IntSplitGroupData_MDL7 *local_480;
  char *local_478;
  uint local_46c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_468;
  IntSharedData_MDL7 *local_450;
  ulong local_448;
  IntBone_MDL7 **local_440;
  uint local_434;
  undefined1 local_430 [1024];
  
  local_450 = splitGroupData->shared;
  ppaVar34 = (local_450->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppaVar36 = (local_450->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppaVar36 != ppaVar34) {
    local_448 = (ulong)*(uint *)(this->mBuffer + 8);
    local_46c = *(uint *)(this->mBuffer + 8) - 1;
    uVar37 = 0;
    local_480 = splitGroupData;
    do {
      ppvVar2 = local_480->aiSplit;
      pvVar3 = ppvVar2[uVar37];
      if ((pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        paVar26 = (aiMesh *)operator_new(0x520);
        paVar26->mNumVertices = 0;
        paVar26->mNumFaces = 0;
        local_490 = &paVar26->mVertices;
        memset(local_490,0,0xcc);
        paVar26->mBones = (aiBone **)0x0;
        paVar26->mMaterialIndex = 0;
        (paVar26->mName).length = 0;
        (paVar26->mName).data[0] = '\0';
        memset((paVar26->mName).data + 1,0x1b,0x3ff);
        paVar26->mNumAnimMeshes = 0;
        paVar26->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar26->mMethod = 0;
        (paVar26->mAABB).mMin.x = 0.0;
        (paVar26->mAABB).mMin.y = 0.0;
        (paVar26->mAABB).mMin.z = 0.0;
        (paVar26->mAABB).mMax.x = 0.0;
        (paVar26->mAABB).mMax.y = 0.0;
        (paVar26->mAABB).mMax.z = 0.0;
        memset(paVar26->mColors,0,0xa0);
        paVar26->mPrimitiveTypes = 4;
        paVar26->mMaterialIndex = (uint)uVar37;
        pvVar3 = ppvVar2[uVar37];
        uVar39 = (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        uVar38 = (uint)uVar39;
        paVar26->mNumFaces = uVar38;
        uVar39 = uVar39 & 0xffffffff;
        local_498 = paVar26;
        local_488 = uVar37;
        puVar27 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
        *puVar27 = uVar39;
        paVar28 = (aiFace *)(puVar27 + 1);
        if (uVar39 != 0) {
          paVar35 = paVar28;
          do {
            paVar35->mNumIndices = 0;
            paVar35->mIndices = (uint *)0x0;
            paVar35 = paVar35 + 1;
          } while (paVar35 != paVar28 + uVar39);
        }
        paVar26->mFaces = paVar28;
        paVar26->mNumVertices = uVar38 * 3;
        uVar37 = (ulong)(uVar38 * 3) * 0xc;
        paVar29 = (aiVector3D *)operator_new__(uVar37);
        if (uVar38 == 0) {
          *local_490 = paVar29;
          paVar29 = (aiVector3D *)operator_new__(uVar37);
        }
        else {
          __n = ((uVar37 - 0xc) / 0xc) * 0xc + 0xc;
          memset(paVar29,0,__n);
          *local_490 = paVar29;
          paVar29 = (aiVector3D *)operator_new__(uVar37);
          memset(paVar29,0,__n);
        }
        paVar26->mNormals = paVar29;
        if ((groupData->vTextureCoords1).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (groupData->vTextureCoords1).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          paVar26->mNumUVComponents[0] = 2;
          paVar29 = (aiVector3D *)operator_new__(uVar37);
          if (uVar38 != 0) {
            memset(paVar29,0,((uVar37 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar26->mTextureCoords[0] = paVar29;
          if ((groupData->vTextureCoords2).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (groupData->vTextureCoords2).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            paVar26->mNumUVComponents[1] = 2;
            paVar29 = (aiVector3D *)operator_new__(uVar37);
            if (uVar38 != 0) {
              memset(paVar29,0,((uVar37 - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar26->mTextureCoords[1] = paVar29;
          }
        }
        if (uVar38 != 0) {
          uVar37 = 0;
          uVar39 = 0;
          do {
            paVar26->mFaces[uVar37].mNumIndices = 3;
            puVar30 = (uint *)operator_new__(0xc);
            local_498->mFaces[uVar37].mIndices = puVar30;
            uVar38 = (local_480->aiSplit[local_488]->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar37];
            pIVar4 = (groupData->pcFaces).
                     super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar31 = 0;
            do {
              uVar25 = pIVar4[uVar38].mIndices[lVar31];
              paVar5 = (groupData->vPositions).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar29 = local_498->mVertices;
              uVar41 = uVar39 + lVar31 & 0xffffffff;
              paVar29[uVar41].z = paVar5[uVar25].z;
              paVar5 = paVar5 + uVar25;
              fVar8 = paVar5->y;
              paVar29 = paVar29 + uVar41;
              paVar29->x = paVar5->x;
              paVar29->y = fVar8;
              paVar5 = (groupData->vNormals).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar29 = local_498->mNormals;
              paVar29[uVar41].z = paVar5[uVar25].z;
              paVar5 = paVar5 + uVar25;
              fVar8 = paVar5->y;
              paVar29 = paVar29 + uVar41;
              paVar29->x = paVar5->x;
              paVar29->y = fVar8;
              paVar5 = (groupData->vTextureCoords1).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (paVar5 != (groupData->vTextureCoords1).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                paVar29 = local_498->mTextureCoords[0];
                paVar29[uVar41].z = paVar5[uVar25].z;
                fVar8 = paVar5[uVar25].y;
                paVar29 = paVar29 + uVar41;
                paVar29->x = paVar5[uVar25].x;
                paVar29->y = fVar8;
                paVar5 = (groupData->vTextureCoords2).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                if (paVar5 != (groupData->vTextureCoords2).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
                  paVar29 = local_498->mTextureCoords[1];
                  paVar29[uVar41].z = paVar5[uVar25].z;
                  fVar8 = paVar5[uVar25].y;
                  paVar29 = paVar29 + uVar41;
                  paVar29->x = paVar5[uVar25].x;
                  paVar29->y = fVar8;
                }
              }
              local_498->mFaces[uVar37].mIndices[lVar31] = (uint)(uVar39 + lVar31);
              lVar31 = lVar31 + 1;
            } while (lVar31 != 3);
            uVar37 = uVar37 + 1;
            uVar39 = (ulong)((int)uVar39 + 3);
            paVar26 = local_498;
          } while (uVar37 < local_498->mNumFaces);
        }
        uVar37 = local_448;
        if ((groupData->aiBones).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (groupData->aiBones).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_468.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_468.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_468.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::resize(&local_468,local_448);
          pvVar7 = local_468.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_498->mNumFaces != 0) {
            uVar39 = 0;
            iVar42 = 0;
            do {
              uVar38 = (local_480->aiSplit[local_488]->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar39];
              pIVar4 = (groupData->pcFaces).
                       super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar31 = 0;
              do {
                uVar25 = (groupData->aiBones).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[pIVar4[uVar38].mIndices[lVar31]];
                if (uVar25 != 0xffffffff) {
                  if ((uint)uVar37 <= uVar25) {
                    this_01 = DefaultLogger::get();
                    Logger::error(this_01,
                                  "Bone index overflow. The bone index of a vertex exceeds the allowed range. "
                                 );
                    uVar25 = local_46c;
                  }
                  local_434 = iVar42 + (int)lVar31;
                  pvVar3 = local_468.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar25;
                  __position._M_current =
                       (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>(pvVar3,__position,&local_434);
                  }
                  else {
                    *__position._M_current = local_434;
                    ppuVar1 = &(pvVar3->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppuVar1 = *ppuVar1 + 1;
                  }
                }
                lVar31 = lVar31 + 1;
              } while (lVar31 != 3);
              uVar39 = uVar39 + 1;
              iVar42 = iVar42 + 3;
              pvVar7 = local_468.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar39 < local_498->mNumFaces);
          }
          for (; pvVar24 = local_468.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
              pvVar40 = local_468.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start, paVar26 = local_498,
              pvVar7 != local_468.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; pvVar7 = pvVar7 + 1) {
            if ((pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start !=
                (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              local_498->mNumBones = local_498->mNumBones + 1;
            }
          }
          ppaVar32 = (aiBone **)operator_new__((ulong)local_498->mNumBones << 3);
          paVar26->mBones = ppaVar32;
          if (pvVar40 != pvVar24) {
            local_490 = (aiVector3D **)0x0;
            do {
              if ((pvVar40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start !=
                  (pvVar40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_finish) {
                paVar33 = (aiBone *)operator_new(0x450);
                (paVar33->mName).length = 0;
                local_478 = (paVar33->mName).data;
                (paVar33->mName).data[0] = '\0';
                memset((paVar33->mName).data + 1,0x1b,0x3ff);
                ppaVar23 = local_490;
                paVar33->mNumWeights = 0;
                paVar33->mWeights = (aiVertexWeight *)0x0;
                (paVar33->mOffsetMatrix).a1 = 1.0;
                (paVar33->mOffsetMatrix).a2 = 0.0;
                (paVar33->mOffsetMatrix).a3 = 0.0;
                (paVar33->mOffsetMatrix).a4 = 0.0;
                (paVar33->mOffsetMatrix).b1 = 0.0;
                (paVar33->mOffsetMatrix).b2 = 1.0;
                (paVar33->mOffsetMatrix).b3 = 0.0;
                (paVar33->mOffsetMatrix).b4 = 0.0;
                (paVar33->mOffsetMatrix).c1 = 0.0;
                (paVar33->mOffsetMatrix).c2 = 0.0;
                (paVar33->mOffsetMatrix).c3 = 1.0;
                (paVar33->mOffsetMatrix).c4 = 0.0;
                (paVar33->mOffsetMatrix).d1 = 0.0;
                (paVar33->mOffsetMatrix).d2 = 0.0;
                (paVar33->mOffsetMatrix).d3 = 0.0;
                (paVar33->mOffsetMatrix).d4 = 1.0;
                local_498->mBones[(long)local_490] = paVar33;
                local_440 = local_450->apcOutBones;
                uVar38 = (local_440[(long)local_490]->super_aiBone).mName.length;
                if (0x3fe < uVar38) {
                  uVar38 = 0x3ff;
                }
                uVar37 = (ulong)uVar38;
                local_434 = uVar38;
                memcpy(local_430,(local_440[(long)local_490]->super_aiBone).mName.data,uVar37);
                local_430[uVar37] = 0;
                (paVar33->mName).length = uVar38;
                memcpy(local_478,local_430,uVar37);
                (paVar33->mName).data[uVar37] = '\0';
                pIVar6 = local_440[(long)ppaVar23];
                fVar19 = (pIVar6->super_aiBone).mOffsetMatrix.a1;
                fVar20 = (pIVar6->super_aiBone).mOffsetMatrix.a2;
                fVar21 = (pIVar6->super_aiBone).mOffsetMatrix.a3;
                fVar22 = (pIVar6->super_aiBone).mOffsetMatrix.a4;
                fVar15 = (pIVar6->super_aiBone).mOffsetMatrix.b1;
                fVar16 = (pIVar6->super_aiBone).mOffsetMatrix.b2;
                fVar17 = (pIVar6->super_aiBone).mOffsetMatrix.b3;
                fVar18 = (pIVar6->super_aiBone).mOffsetMatrix.b4;
                fVar11 = (pIVar6->super_aiBone).mOffsetMatrix.c1;
                fVar12 = (pIVar6->super_aiBone).mOffsetMatrix.c2;
                fVar13 = (pIVar6->super_aiBone).mOffsetMatrix.c3;
                fVar14 = (pIVar6->super_aiBone).mOffsetMatrix.c4;
                fVar8 = (pIVar6->super_aiBone).mOffsetMatrix.d2;
                fVar9 = (pIVar6->super_aiBone).mOffsetMatrix.d3;
                fVar10 = (pIVar6->super_aiBone).mOffsetMatrix.d4;
                (paVar33->mOffsetMatrix).d1 = (pIVar6->super_aiBone).mOffsetMatrix.d1;
                (paVar33->mOffsetMatrix).d2 = fVar8;
                (paVar33->mOffsetMatrix).d3 = fVar9;
                (paVar33->mOffsetMatrix).d4 = fVar10;
                (paVar33->mOffsetMatrix).c1 = fVar11;
                (paVar33->mOffsetMatrix).c2 = fVar12;
                (paVar33->mOffsetMatrix).c3 = fVar13;
                (paVar33->mOffsetMatrix).c4 = fVar14;
                (paVar33->mOffsetMatrix).b1 = fVar15;
                (paVar33->mOffsetMatrix).b2 = fVar16;
                (paVar33->mOffsetMatrix).b3 = fVar17;
                (paVar33->mOffsetMatrix).b4 = fVar18;
                (paVar33->mOffsetMatrix).a1 = fVar19;
                (paVar33->mOffsetMatrix).a2 = fVar20;
                (paVar33->mOffsetMatrix).a3 = fVar21;
                (paVar33->mOffsetMatrix).a4 = fVar22;
                uVar37 = (long)(pvVar40->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar40->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                uVar38 = (uint)uVar37;
                paVar33->mNumWeights = uVar38;
                uVar37 = uVar37 & 0xffffffff;
                local_478 = (char *)(uVar37 * 8);
                __s = (aiVertexWeight *)operator_new__((ulong)local_478);
                if (uVar37 != 0) {
                  memset(__s,0,(size_t)local_478);
                }
                paVar33->mWeights = __s;
                if (uVar38 != 0) {
                  uVar37 = 0;
                  do {
                    paVar33->mWeights[uVar37].mVertexId =
                         (pvVar40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar37];
                    paVar33->mWeights[uVar37].mWeight = 1.0;
                    uVar37 = uVar37 + 1;
                  } while (uVar37 < paVar33->mNumWeights);
                }
              }
              pvVar40 = pvVar40 + 1;
              local_490 = (aiVector3D **)((long)local_490 + 1);
            } while (pvVar40 !=
                     local_468.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector(&local_468);
        }
        this_00 = (vector<aiMesh*,std::allocator<aiMesh*>> *)local_480->avOutList;
        __position_00._M_current = *(aiMesh ***)(this_00 + 8);
        if (__position_00._M_current == *(aiMesh ***)(this_00 + 0x10)) {
          std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                    (this_00,__position_00,&local_498);
        }
        else {
          *__position_00._M_current = local_498;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        ppaVar34 = (local_450->pcMats).
                   super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppaVar36 = (local_450->pcMats).
                   super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        uVar37 = local_488;
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 < (ulong)((long)ppaVar36 - (long)ppaVar34 >> 3));
  }
  return;
}

Assistant:

void MDLImporter::GenerateOutputMeshes_3DGS_MDL7(
    MDL::IntGroupData_MDL7& groupData,
    MDL::IntSplitGroupData_MDL7& splitGroupData)
{
    const MDL::IntSharedData_MDL7& shared = splitGroupData.shared;

    // get a pointer to the header ...
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    const unsigned int iNumOutBones = pcHeader->bones_num;

    for (std::vector<aiMaterial*>::size_type i = 0; i < shared.pcMats.size();++i)   {
        if (!splitGroupData.aiSplit[i]->empty())    {

            // allocate the output mesh
            aiMesh* pcMesh = new aiMesh();

            pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
            pcMesh->mMaterialIndex = (unsigned int)i;

            // allocate output storage
            pcMesh->mNumFaces = (unsigned int)splitGroupData.aiSplit[i]->size();
            pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

            pcMesh->mNumVertices = pcMesh->mNumFaces*3;
            pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];

            if (!groupData.vTextureCoords1.empty()) {
                pcMesh->mNumUVComponents[0] = 2;
                pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
                if (!groupData.vTextureCoords2.empty()) {
                    pcMesh->mNumUVComponents[1] = 2;
                    pcMesh->mTextureCoords[1] = new aiVector3D[pcMesh->mNumVertices];
                }
            }

            // iterate through all faces and build an unique set of vertices
            unsigned int iCurrent = 0;
            for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
                pcMesh->mFaces[iFace].mNumIndices = 3;
                pcMesh->mFaces[iFace].mIndices = new unsigned int[3];

                unsigned int iSrcFace = splitGroupData.aiSplit[i]->operator[](iFace);
                const MDL::IntFace_MDL7& oldFace = groupData.pcFaces[iSrcFace];

                // iterate through all face indices
                for (unsigned int c = 0; c < 3;++c) {
                    const uint32_t iIndex = oldFace.mIndices[c];
                    pcMesh->mVertices[iCurrent] = groupData.vPositions[iIndex];
                    pcMesh->mNormals[iCurrent] = groupData.vNormals[iIndex];

                    if (!groupData.vTextureCoords1.empty()) {

                        pcMesh->mTextureCoords[0][iCurrent] = groupData.vTextureCoords1[iIndex];
                        if (!groupData.vTextureCoords2.empty()) {
                            pcMesh->mTextureCoords[1][iCurrent] = groupData.vTextureCoords2[iIndex];
                        }
                    }
                    pcMesh->mFaces[iFace].mIndices[c] = iCurrent++;
                }
            }

            // if we have bones in the mesh we'll need to generate
            // proper vertex weights for them
            if (!groupData.aiBones.empty()) {
                std::vector<std::vector<unsigned int> > aaiVWeightList;
                aaiVWeightList.resize(iNumOutBones);

                int iCurrent = 0;
                for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
                    unsigned int iSrcFace = splitGroupData.aiSplit[i]->operator[](iFace);
                    const MDL::IntFace_MDL7& oldFace = groupData.pcFaces[iSrcFace];

                    // iterate through all face indices
                    for (unsigned int c = 0; c < 3;++c) {
                        unsigned int iBone = groupData.aiBones[ oldFace.mIndices[c] ];
                        if (UINT_MAX != iBone)  {
                            if (iBone >= iNumOutBones)  {
                                ASSIMP_LOG_ERROR("Bone index overflow. "
                                    "The bone index of a vertex exceeds the allowed range. ");
                                iBone = iNumOutBones-1;
                            }
                            aaiVWeightList[ iBone ].push_back ( iCurrent );
                        }
                        ++iCurrent;
                    }
                }
                // now check which bones are required ...
                for (std::vector<std::vector<unsigned int> >::const_iterator k =  aaiVWeightList.begin();k != aaiVWeightList.end();++k) {
                    if (!(*k).empty()) {
                        ++pcMesh->mNumBones;
                    }
                }
                pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
                iCurrent = 0;
                for (std::vector<std::vector<unsigned int> >::const_iterator k = aaiVWeightList.begin();k!= aaiVWeightList.end();++k,++iCurrent)
                {
                    if ((*k).empty())
                        continue;

                    // seems we'll need this node
                    aiBone* pcBone = pcMesh->mBones[ iCurrent ] = new aiBone();
                    pcBone->mName = aiString(shared.apcOutBones[ iCurrent ]->mName);
                    pcBone->mOffsetMatrix = shared.apcOutBones[ iCurrent ]->mOffsetMatrix;

                    // setup vertex weights
                    pcBone->mNumWeights = (unsigned int)(*k).size();
                    pcBone->mWeights = new aiVertexWeight[pcBone->mNumWeights];

                    for (unsigned int weight = 0; weight < pcBone->mNumWeights;++weight)    {
                        pcBone->mWeights[weight].mVertexId = (*k)[weight];
                        pcBone->mWeights[weight].mWeight = 1.0f;
                    }
                }
            }
            // add the mesh to the list of output meshes
            splitGroupData.avOutList.push_back(pcMesh);
        }
    }
}